

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checkqueue_tests.cpp
# Opt level: O2

void __thiscall
checkqueue_tests::test_CheckQueue_Correct_Random::test_method(test_CheckQueue_Correct_Random *this)

{
  long lVar1;
  unsigned_long uVar2;
  long in_FS_OFFSET;
  _Vector_impl_data in_stack_ffffffffffffff98;
  ulong local_50;
  vector<unsigned_long,_std::allocator<unsigned_long>_> range;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  range.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  range.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  range.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve(&range,100);
  for (local_50 = 2; local_50 < 100000; local_50 = uVar2 + (uVar2 == 0) + local_50) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(&range,&local_50);
    uVar2 = 100000 - local_50;
    if (999 < uVar2) {
      uVar2 = 1000;
    }
    uVar2 = RandomMixin<FastRandomContext>::randrange<unsigned_long>
                      (&(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_NoLockLoggingTestingSetup.
                        super_TestingSetup.super_ChainTestingSetup.super_BasicTestingSetup.m_rng.
                        super_RandomMixin<FastRandomContext>,uVar2);
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&stack0xffffffffffffff98,
             &range);
  CheckQueueTest::Correct_Queue_range
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,
             (vector<unsigned_long,_std::allocator<unsigned_long>_>)in_stack_ffffffffffffff98);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&stack0xffffffffffffff98
            );
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&range.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(test_CheckQueue_Correct_Random)
{
    std::vector<size_t> range;
    range.reserve(100000/1000);
    for (size_t i = 2; i < 100000; i += std::max((size_t)1, (size_t)m_rng.randrange(std::min((size_t)1000, ((size_t)100000) - i))))
        range.push_back(i);
    Correct_Queue_range(range);
}